

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O0

bool libtorrent::anon_unknown_1::extract_files
               (bdecode_node *list,file_storage *target,string *root_dir,ptrdiff_t info_offset,
               char *info_buffer,error_code *ec)

{
  string *this;
  bool bVar1;
  type_t tVar2;
  int num_files;
  bdecode_node local_88;
  int local_48;
  int local_44;
  int end;
  int i;
  error_code *ec_local;
  char *info_buffer_local;
  ptrdiff_t info_offset_local;
  string *root_dir_local;
  file_storage *target_local;
  bdecode_node *list_local;
  
  _end = ec;
  ec_local = (error_code *)info_buffer;
  info_buffer_local = (char *)info_offset;
  info_offset_local = (ptrdiff_t)root_dir;
  root_dir_local = (string *)target;
  target_local = (file_storage *)list;
  tVar2 = bdecode_node::type(list);
  this = root_dir_local;
  if (tVar2 == list_t) {
    num_files = bdecode_node::list_size((bdecode_node *)target_local);
    file_storage::reserve((file_storage *)this,num_files);
    local_44 = 0;
    local_48 = bdecode_node::list_size((bdecode_node *)target_local);
    for (; local_44 < local_48; local_44 = local_44 + 1) {
      bdecode_node::list_at(&local_88,(bdecode_node *)target_local,local_44);
      bVar1 = extract_single_file(&local_88,(file_storage *)root_dir_local,
                                  (string *)info_offset_local,(ptrdiff_t)info_buffer_local,
                                  (char *)ec_local,false,_end);
      bdecode_node::~bdecode_node(&local_88);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        return false;
      }
    }
    file_storage::sanitize_symlinks((file_storage *)root_dir_local);
    list_local._7_1_ = true;
  }
  else {
    boost::system::error_code::operator=(_end,torrent_file_parse_failed);
    list_local._7_1_ = false;
  }
  return list_local._7_1_;
}

Assistant:

bool extract_files(bdecode_node const& list, file_storage& target
		, std::string const& root_dir, std::ptrdiff_t info_offset
		, char const* info_buffer, error_code& ec)
	{
		if (list.type() != bdecode_node::list_t)
		{
			ec = errors::torrent_file_parse_failed;
			return false;
		}
		target.reserve(list.list_size());

		for (int i = 0, end(list.list_size()); i < end; ++i)
		{
			if (!extract_single_file(list.list_at(i), target, root_dir
				, info_offset, info_buffer, false, ec))
				return false;
		}
		// this rewrites invalid symlinks to point to themselves
		target.sanitize_symlinks();
		return true;
	}